

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::DefaultPrintTo<std::vector<int,std::allocator<int>>>
               (undefined8 param_1,undefined8 *param_2,ostream *param_3)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(param_3,"{",1);
  piVar2 = (int *)*param_2;
  piVar1 = (int *)param_2[1];
  if (piVar2 != piVar1) {
    lVar4 = 0;
    do {
      lVar3 = lVar4 + -1;
      if ((lVar4 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(param_3,",",1), lVar4 == -0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(param_3," ...",4);
        goto LAB_001b78eb;
      }
      std::__ostream_insert<char,std::char_traits<char>>(param_3," ",1);
      std::ostream::operator<<(param_3,*piVar2);
      piVar2 = piVar2 + 1;
      lVar4 = lVar3;
    } while (piVar2 != piVar1);
    if (lVar3 != 0) {
LAB_001b78eb:
      std::__ostream_insert<char,std::char_traits<char>>(param_3," ",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_3,"}",1);
  return;
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                        , iutest_type_traits::false_type
                        , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}